

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStackSwitch
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,Name tag)

{
  Name tag_00;
  bool bVar1;
  StackSwitch *expr;
  optional<wasm::HeapType> ct_00;
  Ok local_1d1;
  IRBuilder *local_1d0;
  size_t local_1c8;
  Err local_1c0;
  Err *local_1a0;
  Err *err_1;
  undefined1 local_190 [8];
  Result<wasm::Ok> _val_1;
  Err local_160;
  Err *local_140;
  Err *err;
  undefined1 local_130;
  undefined3 uStack_12f;
  ChildPopper local_128;
  undefined1 local_120 [8];
  Result<wasm::Ok> _val;
  Err local_f0;
  HeapType local_d0;
  Signature local_c8;
  size_t local_b8;
  size_t nparams;
  StackSwitch curr;
  allocator<char> local_51;
  Err local_50;
  IRBuilder *local_30;
  IRBuilder *this_local;
  Name tag_local;
  HeapType ct_local;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  this_local = tag.super_IString.str._M_len;
  local_30 = this;
  tag_local.super_IString.str._M_str = (char *)ct.id;
  bVar1 = HeapType::isContinuation((HeapType *)&tag_local.super_IString.str._M_str);
  if (bVar1) {
    StackSwitch::StackSwitch((StackSwitch *)&nparams,&this->wasm->allocator);
    wasm::Name::operator=
              ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)95>.super_Expression.
                        type,(Name *)&this_local);
    local_d0.id = (uintptr_t)
                  HeapType::getContinuation((HeapType *)&tag_local.super_IString.str._M_str);
    local_c8 = HeapType::getSignature(&local_d0);
    local_b8 = wasm::Type::size(&local_c8.params);
    if (local_b8 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "arity mismatch: the continuation argument must have, at least, unary arity",
                 (allocator<char> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
      wasm::Err::~Err(&local_f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    }
    else {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 &curr.tag.super_IString.str._M_str,local_b8 - 1);
      ChildPopper::ChildPopper(&local_128,this);
      std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
                ((optional<wasm::HeapType> *)&err,(HeapType *)&tag_local.super_IString.str._M_str);
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_130;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_12f;
      ChildPopper::visitStackSwitch
                ((Result<wasm::Ok> *)local_120,&local_128,(StackSwitch *)&nparams,ct_00);
      local_140 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_120);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_140 != (Err *)0x0;
      if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
        wasm::Err::Err(&local_160,local_140);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_160);
        wasm::Err::~Err(&local_160);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_120);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        err_1 = (Err *)tag_local.super_IString.str._M_str;
        anon_unknown_282::validateTypeAnnotation
                  ((Result<wasm::Ok> *)local_190,(HeapType)tag_local.super_IString.str._M_str,
                   (Expression *)curr.operands.allocator);
        local_1a0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_190);
        bVar1 = local_1a0 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_1c0,local_1a0);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1c0);
          wasm::Err::~Err(&local_1c0);
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_190);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          local_1d0 = this_local;
          local_1c8 = tag_local.super_IString.str._M_len;
          tag_00.super_IString.str._M_str = (char *)tag_local.super_IString.str._M_len;
          tag_00.super_IString.str._M_len = (size_t)this_local;
          expr = Builder::makeStackSwitch
                           (&this->builder,tag_00,
                            (ExpressionList *)&curr.tag.super_IString.str._M_str,
                            (Expression *)curr.operands.allocator);
          push(this,(Expression *)expr);
          Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1d1);
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"expected continuation type",&local_51);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
    wasm::Err::~Err(&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStackSwitch(HeapType ct, Name tag) {
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }
  StackSwitch curr(wasm.allocator);
  curr.tag = tag;
  auto nparams = ct.getContinuation().type.getSignature().params.size();
  if (nparams < 1) {
    return Err{"arity mismatch: the continuation argument must have, at least, "
               "unary arity"};
  }

  // The continuation argument of the continuation is synthetic,
  // i.e. it is provided by the runtime.
  curr.operands.resize(nparams - 1);

  CHECK_ERR(ChildPopper{*this}.visitStackSwitch(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeStackSwitch(tag, std::move(curr.operands), curr.cont));
  return Ok{};
}